

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate.cpp
# Opt level: O0

void __thiscall
ktx::ValidationContext::validateKTXwriterScParams
          (ValidationContext *this,uint8_t *data,uint32_t size)

{
  string_view text;
  bool bVar1;
  uint in_EDX;
  char *in_RSI;
  long in_RDI;
  optional<unsigned_long> invalidIndex;
  string_view value;
  undefined4 in_stack_00000050;
  bool hasNull;
  uint local_64;
  bool local_49;
  basic_string_view<char,_std::char_traits<char>_> local_28;
  bool local_15;
  uint local_14;
  char *local_10;
  
  *(undefined1 *)(in_RDI + 0x119) = 1;
  local_49 = false;
  if (in_EDX != 0) {
    local_49 = in_RSI[in_EDX - 1] == '\0';
  }
  local_15 = local_49;
  local_14 = in_EDX;
  local_10 = in_RSI;
  if (local_49 == false) {
    error<>((ValidationContext *)value._M_str,(IssueError *)value._M_len);
  }
  if ((local_15 & 1U) == 0) {
    local_64 = local_14;
  }
  else {
    local_64 = local_14 - 1;
  }
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_28,local_10,(ulong)local_64);
  text._M_str = local_28._M_str;
  text._M_len = local_28._M_len;
  validateUTF8(text);
  bVar1 = std::optional::operator_cast_to_bool((optional<unsigned_long> *)0x2baaa1);
  if (bVar1) {
    std::optional<unsigned_long>::operator*((optional<unsigned_long> *)0x2baab1);
    error<unsigned_long&>
              ((ValidationContext *)data,(IssueError *)CONCAT44(size,in_stack_00000050),
               (unsigned_long *)value._M_str);
  }
  return;
}

Assistant:

void ValidationContext::validateKTXwriterScParams(const uint8_t* data, uint32_t size) {
    foundKTXwriterScParams = true;

    const auto hasNull = size > 0 && data[size - 1] == '\0';
    if (!hasNull)
        error(Metadata::KTXwriterScParamsMissingNull);

    const auto value = std::string_view(reinterpret_cast<const char*>(data), hasNull ? size - 1 : size);
    if (auto invalidIndex = validateUTF8(value))
        error(Metadata::KTXwriterScParamsInvalidUTF8, *invalidIndex);
}